

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::SegmentInfo::Finalize(SegmentInfo *this,IMkvWriter *writer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int64_t pos;
  IMkvWriter *writer_local;
  SegmentInfo *this_local;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  if ((0.0 < this->duration_) && (uVar2 = (*writer->_vptr_IMkvWriter[3])(), (uVar2 & 1) != 0)) {
    if (this->duration_pos_ == -1) {
      return false;
    }
    iVar3 = (*writer->_vptr_IMkvWriter[1])();
    iVar4 = (*writer->_vptr_IMkvWriter[2])(writer,this->duration_pos_);
    if (iVar4 != 0) {
      return false;
    }
    bVar1 = WriteEbmlElement(writer,0x4489,(float)this->duration_);
    if (!bVar1) {
      return false;
    }
    iVar3 = (*writer->_vptr_IMkvWriter[2])(writer,CONCAT44(extraout_var,iVar3));
    if (iVar3 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SegmentInfo::Finalize(IMkvWriter* writer) const {
  if (!writer)
    return false;

  if (duration_ > 0.0) {
    if (writer->Seekable()) {
      if (duration_pos_ == -1)
        return false;

      const int64_t pos = writer->Position();

      if (writer->Position(duration_pos_))
        return false;

      if (!WriteEbmlElement(writer, libwebm::kMkvDuration,
                            static_cast<float>(duration_)))
        return false;

      if (writer->Position(pos))
        return false;
    }
  }

  return true;
}